

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_counters.cpp
# Opt level: O0

int64_t __thiscall libtorrent::counters::operator[](counters *this,int i)

{
  value_type *pvVar1;
  int i_local;
  counters *this_local;
  memory_order __b;
  
  pvVar1 = libtorrent::aux::
           container_wrapper<std::atomic<long>,_long,_std::array<std::atomic<long>,_291UL>_>::
           operator[](&this->m_stats_counter,(long)i);
  ::std::operator&(memory_order_relaxed,__memory_order_mask);
  return (pvVar1->super___atomic_base<long>)._M_i;
}

Assistant:

std::int64_t counters::operator[](int i) const TORRENT_COUNTER_NOEXCEPT
	{
		TORRENT_ASSERT(i >= 0);
		TORRENT_ASSERT(i < num_counters);

#ifdef ATOMIC_LLONG_LOCK_FREE
		return m_stats_counter[i].load(std::memory_order_relaxed);
#else
		std::lock_guard<std::mutex> l(m_mutex);
		return m_stats_counter[i];
#endif
	}